

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

size_t ptls_aead_encrypt(ptls_aead_context_t *ctx,void *output,void *input,size_t inlen,uint64_t seq
                        ,void *aad,size_t aadlen)

{
  size_t sVar1;
  size_t sVar2;
  
  ptls_aead_encrypt_init(ctx,seq,aad,aadlen);
  sVar1 = (*ctx->do_encrypt_update)(ctx,output,input,inlen);
  sVar2 = (*ctx->do_encrypt_final)(ctx,(void *)((long)output + sVar1));
  return sVar2 + sVar1;
}

Assistant:

size_t ptls_aead_encrypt(ptls_aead_context_t *ctx, void *output, const void *input, size_t inlen, uint64_t seq, const void *aad,
                         size_t aadlen)
{
    size_t off = 0;

    ptls_aead_encrypt_init(ctx, seq, aad, aadlen);
    off += ptls_aead_encrypt_update(ctx, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_final(ctx, ((uint8_t *)output) + off);

    return off;
}